

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupDfsCone(Gia_Man_t *p,Gia_Obj_t *pRoot)

{
  uint uVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  
  if ((-1 < (int)(uint)*(undefined8 *)pRoot) ||
     (((uint)*(undefined8 *)pRoot & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsCo(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x792,"Gia_Man_t *Gia_ManDupDfsCone(Gia_Man_t *, Gia_Obj_t *)");
  }
  Gia_ManFillValue(p);
  pNew = Gia_ManStart(p->nObjs);
  pcVar2 = Abc_UtilStrsav(p->pName);
  pNew->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  pNew->pSpec = pcVar2;
  p->pObjs->Value = 0;
  for (iVar4 = 0; iVar4 < p->vCis->nSize; iVar4 = iVar4 + 1) {
    pGVar3 = Gia_ManCi(p,iVar4);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(pNew);
    pGVar3->Value = uVar1;
  }
  Gia_ManDupDfs_rec(pNew,p,pRoot + -(ulong)((uint)*(undefined8 *)pRoot & 0x1fffffff));
  iVar4 = Gia_ObjFanin0Copy(pRoot);
  Gia_ManAppendCo(pNew,iVar4);
  Gia_ManSetRegNum(pNew,0);
  return pNew;
}

Assistant:

Gia_Man_t * Gia_ManDupDfsCone( Gia_Man_t * p, Gia_Obj_t * pRoot )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ObjIsCo(pRoot) );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManDupDfs_rec( pNew, p, Gia_ObjFanin0(pRoot) );
    Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pRoot) );
    Gia_ManSetRegNum( pNew, 0 );
    return pNew;
}